

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetTemplateGlobalValueWithoutCopy::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  TemplateString local_300;
  TemplateString local_2e0;
  TemplateString local_2c0;
  TemplateString local_2a0;
  TemplateString local_280;
  TemplateString local_260;
  char *local_240;
  void *ptr;
  char value [32];
  TemplateDictionaryPeer peer;
  TemplateString local_200;
  TemplateDictionary local_1e0 [8];
  TemplateDictionary dict;
  undefined1 local_170 [8];
  UnsafeArena arena;
  
  ctemplate::UnsafeArena::UnsafeArena((UnsafeArena *)local_170,100);
  ctemplate::TemplateString::TemplateString(&local_200,"Test arena");
  ctemplate::TemplateDictionary::TemplateDictionary(local_1e0,&local_200,(UnsafeArena *)local_170);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer
            ((TemplateDictionaryPeer *)(value + 0x18),local_1e0);
  snprintf((char *)&ptr,0x20,"%s","value");
  local_240 = ctemplate::UnsafeArena::Alloc((UnsafeArena *)local_170,0);
  ctemplate::TemplateString::TemplateString(&local_260,"key");
  ctemplate::TemplateString::TemplateString(&local_280,(char *)&ptr);
  TVar1.length_ = local_260.length_;
  TVar1.ptr_ = local_260.ptr_;
  TVar1.is_immutable_ = local_260.is_immutable_;
  TVar1._17_7_ = local_260._17_7_;
  TVar1.id_ = local_260.id_;
  TVar2.length_ = local_280.length_;
  TVar2.ptr_ = local_280.ptr_;
  TVar2.is_immutable_ = local_280.is_immutable_;
  TVar2._17_7_ = local_280._17_7_;
  TVar2.id_ = local_280.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValueWithoutCopy(TVar1,TVar2);
  pcVar3 = local_240;
  pcVar5 = ctemplate::UnsafeArena::Alloc((UnsafeArena *)local_170,0);
  if (pcVar3 != pcVar5) {
    fprintf(_stderr,"Check failed: %s %s %s\n","ptr","==","arena.Alloc(0)");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2a0,"key");
  ctemplate::TemplateString::TemplateString(&local_2c0,"value");
  bVar4 = ctemplate::TemplateDictionaryPeer::ValueIs
                    ((TemplateDictionaryPeer *)(value + 0x18),&local_2a0,&local_2c0);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    snprintf((char *)&ptr,0x20,"%s","not_value");
    ctemplate::TemplateString::TemplateString(&local_2e0,"key");
    ctemplate::TemplateString::TemplateString(&local_300,"not_v");
    bVar4 = ctemplate::TemplateDictionaryPeer::ValueIs
                      ((TemplateDictionaryPeer *)(value + 0x18),&local_2e0,&local_300);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      ctemplate::TemplateDictionary::~TemplateDictionary(local_1e0);
      ctemplate::UnsafeArena::~UnsafeArena((UnsafeArena *)local_170);
      return;
    }
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"key\", \"not_v\")");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"key\", \"value\")");
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetTemplateGlobalValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);
  TemplateDictionaryPeer peer(&dict);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetTemplateGlobalValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // "not_v" size == value" size
}